

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsluv.c
# Opt level: O1

void xyz2rgb(Triplet *in_out)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = in_out->c * -0.4986107602930033 +
          in_out->a * 3.2409699419045213 + in_out->b * -1.5373831775700935;
  if (dVar1 <= 0.0031308) {
    dVar1 = dVar1 * 12.92;
  }
  else {
    dVar1 = pow(dVar1,0.4166666666666667);
    dVar1 = dVar1 * 1.055 + -0.055;
  }
  dVar3 = in_out->c * 0.04155505740717561 +
          in_out->a * -0.9692436362808798 + in_out->b * 1.8759675015077206;
  if (dVar3 <= 0.0031308) {
    dVar3 = dVar3 * 12.92;
  }
  else {
    dVar3 = pow(dVar3,0.4166666666666667);
    dVar3 = dVar3 * 1.055 + -0.055;
  }
  dVar2 = in_out->c * 1.0569715142428786 +
          in_out->a * 0.05563007969699361 + in_out->b * -0.20397695888897657;
  if (dVar2 <= 0.0031308) {
    dVar2 = dVar2 * 12.92;
  }
  else {
    dVar2 = pow(dVar2,0.4166666666666667);
    dVar2 = dVar2 * 1.055 + -0.055;
  }
  in_out->a = dVar1;
  in_out->b = dVar3;
  in_out->c = dVar2;
  return;
}

Assistant:

static void
xyz2rgb(Triplet* in_out)
{
    double r = from_linear(dot_product(&m[0], in_out));
    double g = from_linear(dot_product(&m[1], in_out));
    double b = from_linear(dot_product(&m[2], in_out));
    in_out->a = r;
    in_out->b = g;
    in_out->c = b;
}